

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::LinearDerivateCase::init(LinearDerivateCase *this,EVP_PKEY_CTX *ctx)

{
  Vec4 *a;
  Vec4 *b;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Precision PVar8;
  int iVar9;
  DataType dataType;
  int extraout_EAX;
  mapped_type *pmVar10;
  ulong uVar11;
  Precision precision;
  float fVar12;
  float fVar13;
  Vec4 dx;
  Vec4 dy;
  undefined1 local_c8 [8];
  size_type sStack_c0;
  Vector<float,_4> local_a8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragmentParams;
  Vector<float,_4> local_48;
  Vector<float,_4> local_38;
  IVec2 viewportSize;
  
  TriangleDerivateCase::getViewportSize((TriangleDerivateCase *)&viewportSize);
  fVar12 = (float)viewportSize.m_data[0];
  fVar13 = (float)viewportSize.m_data[1];
  PVar8 = (this->super_TriangleDerivateCase).m_surfaceType;
  fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header;
  fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fragmentParams._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  dataType = TYPE_FLOAT_VEC4;
  if (PVar8 == PRECISION_HIGHP) {
    dataType = TYPE_UINT_VEC4;
  }
  fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fragmentParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::getDataTypeName(dataType);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dx,"OUTPUT_TYPE",(allocator<char> *)&dy);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&fragmentParams,(key_type *)&dx);
  std::__cxx11::string::assign((char *)pmVar10);
  std::__cxx11::string::~string((string *)&dx);
  precision = PVar8;
  if (PVar8 != PRECISION_HIGHP) {
    precision = (this->super_TriangleDerivateCase).m_precision;
  }
  glu::getPrecisionName(precision);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dx,"OUTPUT_PREC",(allocator<char> *)&dy);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&fragmentParams,(key_type *)&dx);
  std::__cxx11::string::assign((char *)pmVar10);
  std::__cxx11::string::~string((string *)&dx);
  glu::getPrecisionName((this->super_TriangleDerivateCase).m_precision);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dx,"PRECISION",(allocator<char> *)&dy);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&fragmentParams,(key_type *)&dx);
  std::__cxx11::string::assign((char *)pmVar10);
  std::__cxx11::string::~string((string *)&dx);
  glu::getDataTypeName((this->super_TriangleDerivateCase).m_dataType);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dx,"DATATYPE",(allocator<char> *)&dy);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&fragmentParams,(key_type *)&dx);
  std::__cxx11::string::assign((char *)pmVar10);
  std::__cxx11::string::~string((string *)&dx);
  std::__cxx11::string::string<std::allocator<char>>((string *)&dx,"FUNC",(allocator<char> *)&dy);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&fragmentParams,(key_type *)&dx);
  std::__cxx11::string::assign((char *)pmVar10);
  std::__cxx11::string::~string((string *)&dx);
  if (PVar8 == PRECISION_HIGHP) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dx,"CAST_TO_OUTPUT",(allocator<char> *)&dy);
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&fragmentParams,(key_type *)&dx);
    std::__cxx11::string::assign((char *)pmVar10);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dx,"CAST_TO_OUTPUT",(allocator<char> *)&dy);
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&fragmentParams,(key_type *)&dx);
    std::__cxx11::string::assign((char *)pmVar10);
  }
  std::__cxx11::string::~string((string *)&dx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,(this->m_fragmentTmpl)._M_dataplus._M_p,(allocator<char> *)&local_a8
            );
  tcu::StringTemplate::StringTemplate((StringTemplate *)&dy,(string *)local_c8);
  tcu::StringTemplate::specialize((string *)&dx,(StringTemplate *)&dy,&fragmentParams);
  std::__cxx11::string::operator=
            ((string *)&(this->super_TriangleDerivateCase).m_fragmentSrc,(string *)&dx);
  std::__cxx11::string::~string((string *)&dx);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&dy);
  std::__cxx11::string::~string((string *)local_c8);
  uVar11 = (ulong)(this->super_TriangleDerivateCase).m_precision;
  if (uVar11 < 3) {
    fVar1 = *(float *)(&DAT_0186273c + uVar11 * 4);
    fVar2 = *(float *)(&DAT_01862748 + uVar11 * 4);
    fVar3 = *(float *)(&DAT_01862754 + uVar11 * 4);
    fVar4 = *(float *)(&DAT_01862760 + uVar11 * 4);
    fVar5 = *(float *)(&DAT_0186276c + uVar11 * 4);
    fVar6 = *(float *)(&DAT_01862778 + uVar11 * 4);
    fVar7 = *(float *)(&DAT_01862784 + uVar11 * 4);
    (this->super_TriangleDerivateCase).m_coordMin.m_data[0] = *(float *)(&DAT_01862730 + uVar11 * 4)
    ;
    (this->super_TriangleDerivateCase).m_coordMin.m_data[1] = fVar1;
    (this->super_TriangleDerivateCase).m_coordMin.m_data[2] = fVar2;
    (this->super_TriangleDerivateCase).m_coordMin.m_data[3] = fVar3;
    (this->super_TriangleDerivateCase).m_coordMax.m_data[0] = fVar4;
    (this->super_TriangleDerivateCase).m_coordMax.m_data[1] = fVar5;
    (this->super_TriangleDerivateCase).m_coordMax.m_data[2] = fVar6;
    (this->super_TriangleDerivateCase).m_coordMax.m_data[3] = fVar7;
  }
  if ((this->super_TriangleDerivateCase).m_surfaceType == SURFACETYPE_FLOAT_FBO) {
    tcu::Vector<float,_4>::Vector(&dx,1.0);
    *(ulong *)(this->super_TriangleDerivateCase).m_derivScale.m_data =
         CONCAT44(dx.m_data[1],dx.m_data[0]);
    *(ulong *)((this->super_TriangleDerivateCase).m_derivScale.m_data + 2) =
         CONCAT44(dx.m_data[3],dx.m_data[2]);
    tcu::Vector<float,_4>::Vector(&dx,0.0);
    goto LAB_010ef81c;
  }
  a = &(this->super_TriangleDerivateCase).m_coordMax;
  b = &(this->super_TriangleDerivateCase).m_coordMin;
  tcu::operator-((tcu *)&dy,a,b);
  sStack_c0 = CONCAT44(fVar12 * -0.5,fVar12 * 0.5);
  local_c8._0_4_ = fVar12;
  local_c8._4_4_ = fVar12;
  tcu::operator/((tcu *)&dx,&dy,(Vector<float,_4> *)local_c8);
  tcu::operator-((tcu *)local_c8,a,b);
  local_a8.m_data[3] = fVar13 * -0.5;
  local_a8.m_data[2] = fVar13 * 0.5;
  local_a8.m_data[0] = fVar13;
  local_a8.m_data[1] = fVar13;
  tcu::operator/((tcu *)&dy,(Vector<float,_4> *)local_c8,&local_a8);
  iVar9 = *(int *)&(this->super_TriangleDerivateCase).field_0xf4;
  if (iVar9 == 0) {
    tcu::operator/((tcu *)local_c8,0.5,&dx);
LAB_010ef80d:
    *(ulong *)(this->super_TriangleDerivateCase).m_derivScale.m_data =
         CONCAT44(local_c8._4_4_,local_c8._0_4_);
    *(size_type *)((this->super_TriangleDerivateCase).m_derivScale.m_data + 2) = sStack_c0;
  }
  else {
    if (iVar9 == 1) {
      tcu::operator/((tcu *)local_c8,0.5,&dy);
      goto LAB_010ef80d;
    }
    if (iVar9 == 2) {
      tcu::abs<float,4>((tcu *)&local_38,&dx);
      tcu::abs<float,4>((tcu *)&local_48,&dy);
      tcu::operator+((tcu *)&local_a8,&local_38,&local_48);
      tcu::operator/((tcu *)local_c8,0.5,&local_a8);
      goto LAB_010ef80d;
    }
  }
  dx.m_data[0] = 0.0;
  dx.m_data[1] = 0.0;
  dx.m_data[2] = 0.0;
  dx.m_data[3] = 0.0;
LAB_010ef81c:
  (this->super_TriangleDerivateCase).m_derivBias.m_data[0] = dx.m_data[0];
  (this->super_TriangleDerivateCase).m_derivBias.m_data[1] = dx.m_data[1];
  (this->super_TriangleDerivateCase).m_derivBias.m_data[2] = dx.m_data[2];
  (this->super_TriangleDerivateCase).m_derivBias.m_data[3] = dx.m_data[3];
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&fragmentParams._M_t);
  return extraout_EAX;
}

Assistant:

void LinearDerivateCase::init (void)
{
	const tcu::IVec2	viewportSize	= getViewportSize();
	const float			w				= float(viewportSize.x());
	const float			h				= float(viewportSize.y());
	const bool			packToInt		= m_surfaceType == SURFACETYPE_FLOAT_FBO;
	map<string, string>	fragmentParams;

	fragmentParams["OUTPUT_TYPE"]		= glu::getDataTypeName(packToInt ? glu::TYPE_UINT_VEC4 : glu::TYPE_FLOAT_VEC4);
	fragmentParams["OUTPUT_PREC"]		= glu::getPrecisionName(packToInt ? glu::PRECISION_HIGHP : m_precision);
	fragmentParams["PRECISION"]			= glu::getPrecisionName(m_precision);
	fragmentParams["DATATYPE"]			= glu::getDataTypeName(m_dataType);
	fragmentParams["FUNC"]				= getDerivateFuncName(m_func);

	if (packToInt)
	{
		fragmentParams["CAST_TO_OUTPUT"]	= m_dataType == glu::TYPE_FLOAT_VEC4 ? "floatBitsToUint(res)" :
											  m_dataType == glu::TYPE_FLOAT_VEC3 ? "floatBitsToUint(vec4(res, 1.0))" :
											  m_dataType == glu::TYPE_FLOAT_VEC2 ? "floatBitsToUint(vec4(res, 0.0, 1.0))" :
											  /* TYPE_FLOAT */					   "floatBitsToUint(vec4(res, 0.0, 0.0, 1.0))";
	}
	else
	{
		fragmentParams["CAST_TO_OUTPUT"]	= m_dataType == glu::TYPE_FLOAT_VEC4 ? "res" :
											  m_dataType == glu::TYPE_FLOAT_VEC3 ? "vec4(res, 1.0)" :
											  m_dataType == glu::TYPE_FLOAT_VEC2 ? "vec4(res, 0.0, 1.0)" :
											  /* TYPE_FLOAT */					   "vec4(res, 0.0, 0.0, 1.0)";
	}

	m_fragmentSrc = tcu::StringTemplate(m_fragmentTmpl.c_str()).specialize(fragmentParams);

	switch (m_precision)
	{
		case glu::PRECISION_HIGHP:
			m_coordMin = tcu::Vec4(-97.f, 0.2f, 71.f, 74.f);
			m_coordMax = tcu::Vec4(-13.2f, -77.f, 44.f, 76.f);
			break;

		case glu::PRECISION_MEDIUMP:
			m_coordMin = tcu::Vec4(-37.0f, 47.f, -7.f, 0.0f);
			m_coordMax = tcu::Vec4(-1.0f, 12.f, 7.f, 19.f);
			break;

		case glu::PRECISION_LOWP:
			m_coordMin = tcu::Vec4(0.0f, -1.0f, 0.0f, 1.0f);
			m_coordMax = tcu::Vec4(1.0f, 1.0f, -1.0f, -1.0f);
			break;

		default:
			DE_ASSERT(false);
	}

	if (m_surfaceType == SURFACETYPE_FLOAT_FBO)
	{
		// No scale or bias used for accuracy.
		m_derivScale	= tcu::Vec4(1.0f);
		m_derivBias		= tcu::Vec4(0.0f);
	}
	else
	{
		// Compute scale - bias that normalizes to 0..1 range.
		const tcu::Vec4 dx = (m_coordMax - m_coordMin) / tcu::Vec4(w, w, w*0.5f, -w*0.5f);
		const tcu::Vec4 dy = (m_coordMax - m_coordMin) / tcu::Vec4(h, h, h*0.5f, -h*0.5f);

		switch (m_func)
		{
			case DERIVATE_DFDX:
				m_derivScale = 0.5f / dx;
				break;

			case DERIVATE_DFDY:
				m_derivScale = 0.5f / dy;
				break;

			case DERIVATE_FWIDTH:
				m_derivScale = 0.5f / (tcu::abs(dx) + tcu::abs(dy));
				break;

			default:
				DE_ASSERT(false);
		}

		m_derivBias = tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f);
	}
}